

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Flatten_x86::forward_int8(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  bool bVar10;
  int i_2;
  char *outptr;
  char *ptr_2;
  int q_1;
  int i_1;
  char *outptr7_1;
  char *outptr6_1;
  char *outptr5_1;
  char *outptr4_1;
  char *outptr3_1;
  char *outptr2_1;
  char *outptr1_1;
  char *outptr0_1;
  char *ptr_1;
  int q;
  int j;
  char *outptr7;
  char *outptr6;
  char *outptr5;
  char *outptr4;
  char *outptr3;
  char *outptr2;
  char *outptr1;
  char *outptr0;
  char *ptr;
  int i;
  size_t out_elemsize;
  int out_elempack;
  int total;
  int size;
  int elempack;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  size_t in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  Mat *in_stack_fffffffffffffb40;
  int local_464;
  undefined1 *local_460;
  Option *in_stack_fffffffffffffbc0;
  Mat *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  Flatten *in_stack_fffffffffffffbd8;
  undefined1 *local_410;
  int local_408;
  int local_404;
  undefined1 *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_368;
  int local_360;
  int local_35c;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  int local_30c;
  int local_300;
  int local_2ac;
  
  iVar1 = (int)in_RSI[5];
  if (iVar1 == 1) {
    if (in_RDX != in_RSI) {
      if (in_RSI[1] != 0) {
        LOCK();
        *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
        UNLOCK();
      }
      if (in_RDX[1] != 0) {
        piVar5 = (int *)in_RDX[1];
        LOCK();
        iVar1 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (in_RDX[4] == 0) {
            if ((void *)*in_RDX != (void *)0x0) {
              free((void *)*in_RDX);
            }
          }
          else {
            (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
          }
        }
      }
      *in_RDX = 0;
      in_RDX[2] = 0;
      *(undefined4 *)(in_RDX + 3) = 0;
      *(undefined4 *)(in_RDX + 5) = 0;
      *(undefined4 *)((long)in_RDX + 0x2c) = 0;
      *(undefined4 *)(in_RDX + 6) = 0;
      *(undefined4 *)((long)in_RDX + 0x34) = 0;
      *(undefined4 *)(in_RDX + 7) = 0;
      in_RDX[8] = 0;
      in_RDX[1] = 0;
      *in_RDX = *in_RSI;
      in_RDX[1] = in_RSI[1];
      in_RDX[2] = in_RSI[2];
      *(int *)(in_RDX + 3) = (int)in_RSI[3];
      in_RDX[4] = in_RSI[4];
      *(int *)(in_RDX + 5) = (int)in_RSI[5];
      *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
      *(int *)(in_RDX + 6) = (int)in_RSI[6];
      *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
      *(int *)(in_RDX + 7) = (int)in_RSI[7];
      in_RDX[8] = in_RSI[8];
    }
    local_2ac = 0;
  }
  else {
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    lVar7 = in_RSI[6];
    iVar3 = (int)in_RSI[7];
    uVar6 = in_RSI[2];
    iVar4 = (int)in_RSI[3];
    iVar8 = iVar2 * (int)lVar7 * *(int *)((long)in_RSI + 0x34);
    iVar9 = iVar8 * iVar3 * iVar4;
    local_300 = 1;
    if (((*(byte *)(in_RCX + 0x27) & 1) != 0) && (local_300 = 1, iVar9 % 8 == 0)) {
      local_300 = 8;
    }
    if (local_300 == 1) {
      local_2ac = Flatten::forward(in_stack_fffffffffffffbd8,
                                   (Mat *)CONCAT44(in_stack_fffffffffffffbd4,
                                                   in_stack_fffffffffffffbd0),
                                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    }
    else if ((iVar1 == 2) && (iVar4 == 1)) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          LOCK();
          *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
          UNLOCK();
        }
        if (in_RDX[1] != 0) {
          piVar5 = (int *)in_RDX[1];
          LOCK();
          iVar1 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (in_RDX[4] == 0) {
              if ((void *)*in_RDX != (void *)0x0) {
                free((void *)*in_RDX);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))
                        ((long *)in_RDX[4],*in_RDX,uVar6 % (ulong)(long)iVar4);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *in_RSI;
        in_RDX[1] = in_RSI[1];
        in_RDX[2] = in_RSI[2];
        *(int *)(in_RDX + 3) = (int)in_RSI[3];
        in_RDX[4] = in_RSI[4];
        *(int *)(in_RDX + 5) = (int)in_RSI[5];
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
        *(int *)(in_RDX + 6) = (int)in_RSI[6];
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
        *(int *)(in_RDX + 7) = (int)in_RSI[7];
        in_RDX[8] = in_RSI[8];
      }
      *(undefined4 *)(in_RDX + 5) = 1;
      *(int *)((long)in_RDX + 0x2c) = iVar9 / local_300;
      *(undefined4 *)(in_RDX + 6) = 1;
      in_RDX[8] = (long)*(int *)((long)in_RDX + 0x2c);
      in_RDX[2] = (uVar6 / (ulong)(long)iVar4) * (long)local_300;
      *(int *)(in_RDX + 3) = local_300;
      local_2ac = 0;
    }
    else {
      Mat::create(in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                  in_stack_fffffffffffffb30,(int)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                  in_stack_fffffffffffffb20);
      bVar10 = true;
      if (*in_RDX != 0) {
        bVar10 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
      }
      if (bVar10) {
        local_2ac = -100;
      }
      else {
        if ((iVar1 == 2) && (iVar4 == 8)) {
          for (local_30c = 0; local_30c < (int)lVar7; local_30c = local_30c + 1) {
            local_318 = (undefined1 *)
                        (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_30c * in_RSI[2]
                        );
            local_358 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 7)));
            local_350 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 6)));
            local_348 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 5)));
            local_340 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 4)));
            local_338 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 3)));
            local_330 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 2)));
            local_328 = (undefined1 *)(*in_RDX + (long)(iVar2 * (local_30c * 8 + 1)));
            local_320 = (undefined1 *)(*in_RDX + (long)(iVar2 * local_30c * 8));
            for (local_35c = 0; local_35c < iVar2; local_35c = local_35c + 1) {
              *local_320 = *local_318;
              *local_328 = local_318[1];
              *local_330 = local_318[2];
              *local_338 = local_318[3];
              *local_340 = local_318[4];
              *local_348 = local_318[5];
              *local_350 = local_318[6];
              *local_358 = local_318[7];
              local_318 = local_318 + 8;
              local_358 = local_358 + 1;
              local_350 = local_350 + 1;
              local_348 = local_348 + 1;
              local_340 = local_340 + 1;
              local_338 = local_338 + 1;
              local_330 = local_330 + 1;
              local_328 = local_328 + 1;
              local_320 = local_320 + 1;
            }
          }
        }
        if ((iVar1 == 3) || (iVar1 == 4)) {
          if (iVar4 == 8) {
            for (local_360 = 0; local_360 < iVar3; local_360 = local_360 + 1) {
              local_368 = (undefined1 *)(*in_RSI + in_RSI[8] * (long)local_360 * in_RSI[2]);
              local_400 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 7)));
              local_3f8 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 6)));
              local_3f0 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 5)));
              local_3e8 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 4)));
              local_3e0 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 3)));
              local_3d8 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 2)));
              local_3d0 = (undefined1 *)(*in_RDX + (long)(iVar8 * (local_360 * 8 + 1)));
              local_3c8 = (undefined1 *)(*in_RDX + (long)(iVar8 * local_360 * 8));
              for (local_404 = 0; local_404 < iVar8; local_404 = local_404 + 1) {
                *local_3c8 = *local_368;
                *local_3d0 = local_368[1];
                *local_3d8 = local_368[2];
                *local_3e0 = local_368[3];
                *local_3e8 = local_368[4];
                *local_3f0 = local_368[5];
                *local_3f8 = local_368[6];
                *local_400 = local_368[7];
                local_368 = local_368 + 8;
                local_400 = local_400 + 1;
                local_3f8 = local_3f8 + 1;
                local_3f0 = local_3f0 + 1;
                local_3e8 = local_3e8 + 1;
                local_3e0 = local_3e0 + 1;
                local_3d8 = local_3d8 + 1;
                local_3d0 = local_3d0 + 1;
                local_3c8 = local_3c8 + 1;
              }
            }
          }
          if (iVar4 == 1) {
            for (local_408 = 0; local_408 < iVar3; local_408 = local_408 + 1) {
              local_460 = (undefined1 *)(*in_RDX + (long)(iVar8 * local_408));
              local_410 = (undefined1 *)(*in_RSI + in_RSI[8] * (long)local_408 * in_RSI[2]);
              for (local_464 = 0; local_464 < iVar8; local_464 = local_464 + 1) {
                *local_460 = *local_410;
                local_460 = local_460 + 1;
                local_410 = local_410 + 1;
              }
            }
          }
        }
        local_2ac = 0;
      }
    }
  }
  return local_2ac;
}

Assistant:

int Flatten_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
        out_elempack = total % 8 == 0 ? 8 : 1;
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* ptr = bottom_blob.row<const signed char>(i);
                signed char* outptr0 = (signed char*)top_blob + w * i * 8;
                signed char* outptr1 = (signed char*)top_blob + w * (i * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + w * (i * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + w * (i * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + w * (i * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + w * (i * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + w * (i * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr0 = (signed char*)top_blob + size * q * 8;
                signed char* outptr1 = (signed char*)top_blob + size * (q * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + size * (q * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + size * (q * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + size * (q * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + size * (q * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + size * (q * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }

        if (elempack == 1) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr = (signed char*)top_blob + size * q;

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}